

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void P_ClearACSVars(bool alsoglobal)

{
  long lVar1;
  
  lVar1 = 0;
  memset(ACS_WorldVars,0,0x400);
  do {
    M_Free(*(void **)((long)&ACS_WorldArrays[0].Nodes + lVar1));
    *(undefined8 *)((long)&ACS_WorldArrays[0].Nodes + lVar1) = 0;
    *(undefined8 *)((long)&ACS_WorldArrays[0].LastFree + lVar1) = 0;
    *(undefined8 *)((long)&ACS_WorldArrays[0].Size + lVar1) = 0;
    TMap<int,_int,_THashTraits<int>,_InitIntToZero>::SetNodeVector
              ((TMap<int,_int,_THashTraits<int>,_InitIntToZero> *)
               ((long)&ACS_WorldArrays[0].Nodes + lVar1),1);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1800);
  if (alsoglobal) {
    lVar1 = 0;
    memset(ACS_GlobalVars,0,0x100);
    do {
      M_Free(*(void **)((long)&ACS_GlobalArrays[0].Nodes + lVar1));
      *(undefined8 *)((long)&ACS_GlobalArrays[0].Nodes + lVar1) = 0;
      *(undefined8 *)((long)&ACS_GlobalArrays[0].LastFree + lVar1) = 0;
      *(undefined8 *)((long)&ACS_GlobalArrays[0].Size + lVar1) = 0;
      TMap<int,_int,_THashTraits<int>,_InitIntToZero>::SetNodeVector
                ((TMap<int,_int,_THashTraits<int>,_InitIntToZero> *)
                 ((long)&ACS_GlobalArrays[0].Nodes + lVar1),1);
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x600);
    if (GlobalACSStrings.Pool.Count != 0) {
      TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::DoDelete
                (&GlobalACSStrings.Pool,0,GlobalACSStrings.Pool.Count - 1);
      GlobalACSStrings.Pool.Count = 0;
    }
    memset(GlobalACSStrings.PoolBuckets,0xff,0x3ec);
    GlobalACSStrings.FirstFreeEntry = 0;
    return;
  }
  P_MarkGlobalVarStrings();
  ACSStringPool::PurgeStrings(&GlobalACSStrings);
  return;
}

Assistant:

void P_ClearACSVars(bool alsoglobal)
{
	int i;

	memset (ACS_WorldVars, 0, sizeof(ACS_WorldVars));
	for (i = 0; i < NUM_WORLDVARS; ++i)
	{
		ACS_WorldArrays[i].Clear ();
	}
	if (alsoglobal)
	{
		memset (ACS_GlobalVars, 0, sizeof(ACS_GlobalVars));
		for (i = 0; i < NUM_GLOBALVARS; ++i)
		{
			ACS_GlobalArrays[i].Clear ();
		}
		// Since we cleared all ACS variables, we know nothing refers to them
		// anymore.
		GlobalACSStrings.Clear();
	}
	else
	{
		// Purge any strings that aren't referenced by global variables, since
		// they're the only possible references left.
		P_MarkGlobalVarStrings();
		GlobalACSStrings.PurgeStrings();
	}
}